

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

void __thiscall
flatbuffers::ts::TsGenerator::TsGenerator
          (TsGenerator *this,Parser *parser,string *path,string *file_name)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long *plVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Config result;
  allocator_type local_962;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_961;
  string local_960;
  string local_940;
  string local_920;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_900;
  Config local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  undefined4 *local_760;
  undefined8 local_758;
  undefined4 local_750;
  undefined2 local_74c;
  undefined4 *local_740;
  undefined8 local_738;
  undefined4 local_730;
  undefined1 local_72c;
  undefined4 *local_720;
  undefined8 local_718;
  undefined4 local_710;
  undefined2 local_70c;
  undefined4 *local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  undefined1 local_6ec;
  undefined1 local_6eb;
  undefined4 *local_6e0;
  undefined8 local_6d8;
  undefined4 local_6d0;
  undefined2 local_6cc;
  undefined8 *local_6c0;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined1 local_6a8;
  undefined8 *local_6a0;
  undefined8 local_698;
  undefined8 local_690;
  undefined1 local_688;
  undefined4 *local_680;
  undefined8 local_678;
  undefined4 local_670;
  undefined3 uStack_66c;
  undefined1 local_669;
  undefined4 *local_660;
  undefined8 local_658;
  undefined4 local_650;
  undefined2 local_64c;
  undefined1 local_64a;
  undefined2 *local_640;
  undefined8 local_638;
  undefined2 local_630;
  undefined1 local_62e;
  undefined4 *local_620;
  undefined8 local_618;
  undefined4 local_610;
  undefined1 local_60c;
  undefined4 *local_600;
  undefined8 local_5f8;
  undefined4 local_5f0;
  undefined1 local_5ec;
  undefined4 *local_5e0;
  undefined8 local_5d8;
  undefined4 local_5d0;
  undefined2 local_5cc;
  undefined1 local_5ca;
  undefined4 *local_5c0;
  undefined8 local_5b8;
  undefined4 local_5b0;
  undefined3 uStack_5ac;
  undefined1 local_5a9;
  undefined4 *local_5a0;
  undefined8 local_598;
  undefined4 local_590;
  undefined1 local_58c;
  undefined1 local_58b;
  undefined4 *local_580;
  undefined8 local_578;
  undefined4 local_570;
  undefined3 uStack_56c;
  undefined1 local_569;
  undefined2 *local_560;
  undefined8 local_558;
  undefined2 local_550;
  undefined1 local_54e;
  undefined1 local_54d;
  undefined8 *local_540;
  undefined8 local_538;
  undefined8 local_530;
  undefined1 local_528;
  undefined2 *local_520;
  undefined8 local_518;
  undefined2 local_510;
  undefined1 local_50e;
  undefined4 *local_500;
  undefined8 local_4f8;
  undefined4 local_4f0;
  undefined2 local_4ec;
  undefined1 local_4ea;
  undefined2 *local_4e0;
  undefined8 local_4d8;
  undefined2 local_4d0;
  undefined1 local_4ce;
  undefined8 *local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined2 local_4a8;
  undefined1 local_4a6;
  undefined2 *local_4a0;
  undefined8 local_498;
  undefined2 local_490;
  undefined1 local_48e;
  undefined1 local_48d;
  undefined4 *local_480;
  undefined8 local_478;
  undefined4 local_470;
  undefined1 local_46c;
  undefined4 *local_460;
  undefined8 local_458;
  undefined4 local_450;
  undefined2 local_44c;
  undefined1 local_44a;
  undefined4 *local_440;
  undefined8 local_438;
  undefined4 local_430;
  undefined2 local_42c;
  undefined1 local_42a;
  undefined4 *local_420;
  undefined8 local_418;
  undefined4 local_410;
  undefined1 local_40c;
  undefined1 local_40b;
  undefined4 *local_400;
  undefined8 local_3f8;
  undefined4 local_3f0;
  undefined2 local_3ec;
  undefined1 local_3ea;
  undefined4 *local_3e0;
  undefined8 local_3d8;
  undefined4 local_3d0;
  undefined1 local_3cc;
  undefined4 *local_3c0;
  undefined8 local_3b8;
  undefined4 local_3b0;
  undefined1 local_3ac;
  undefined1 local_3ab;
  undefined4 *local_3a0;
  undefined8 local_398;
  undefined4 local_390;
  undefined1 local_38c;
  undefined2 *local_380;
  undefined8 local_378;
  undefined2 local_370;
  undefined1 local_36e;
  undefined1 local_36d;
  undefined4 *local_360;
  undefined8 local_358;
  undefined4 local_350;
  undefined2 local_34c;
  undefined1 local_34a;
  undefined2 *local_340;
  undefined8 local_338;
  undefined2 local_330;
  undefined1 local_32e;
  undefined1 local_32d;
  undefined4 *local_320;
  undefined8 local_318;
  undefined4 local_310;
  undefined1 local_30c;
  undefined4 *local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined1 local_2ec;
  undefined1 local_2eb;
  undefined4 *local_2e0;
  undefined8 local_2d8;
  undefined4 local_2d0;
  undefined1 local_2cc;
  undefined2 *local_2c0;
  undefined8 local_2b8;
  undefined2 local_2b0;
  undefined1 local_2ae;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined2 local_288;
  undefined1 local_286;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined1 local_267;
  undefined2 *local_260;
  undefined8 local_258;
  undefined2 local_250;
  undefined1 local_24e;
  undefined1 local_24d;
  undefined4 *local_240;
  undefined8 local_238;
  undefined4 local_230;
  undefined3 uStack_22c;
  undefined1 local_229;
  undefined4 *local_220;
  undefined8 local_218;
  undefined4 local_210;
  undefined3 uStack_20c;
  undefined1 local_209;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined1 local_1e7;
  undefined4 *local_1e0;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined2 local_1cc;
  undefined1 local_1ca;
  undefined4 *local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined2 uStack_1ac;
  undefined1 uStack_1aa;
  long *local_1a0 [2];
  undefined8 local_190;
  undefined1 local_180 [136];
  string local_f8 [104];
  string local_90 [32];
  string local_70 [64];
  
  local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_940,"");
  local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"_","");
  local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_920,"ts","");
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,file_name,&local_940,&local_960,&local_920);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p != &local_920.field_2) {
    operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_960._M_dataplus._M_p != &local_960.field_2) {
    operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
  }
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_003f3868;
  local_8d0.enum_variant_seperator._M_dataplus._M_p =
       (pointer)&local_8d0.enum_variant_seperator.field_2;
  local_8d0.types = kKeep;
  local_8d0.constants = kUnknown;
  local_8d0.methods = kLowerCamel;
  local_8d0.functions = kLowerCamel;
  local_8d0.fields = kLowerCamel;
  local_8d0.variables = kLowerCamel;
  local_8d0.variants = kKeep;
  local_8d0.enum_variant_seperator.field_2._M_allocated_capacity._0_2_ = 0x3a3a;
  local_8d0.enum_variant_seperator._M_string_length = 2;
  local_8d0.enum_variant_seperator.field_2._M_local_buf[2] = '\0';
  local_8d0.escape_keywords = AfterConvertingCase;
  local_8d0.namespaces = kKeep;
  local_8d0.namespace_seperator._M_dataplus._M_p = (pointer)&local_8d0.namespace_seperator.field_2;
  local_8d0.namespace_seperator.field_2._M_allocated_capacity._0_2_ = 0x5f;
  local_8d0.namespace_seperator._M_string_length = 1;
  local_8d0.object_prefix._M_dataplus._M_p = (pointer)&local_8d0.object_prefix.field_2;
  local_8d0.object_prefix._M_string_length = 0;
  local_8d0.object_prefix.field_2._M_local_buf[0] = '\0';
  local_8d0.object_suffix._M_dataplus._M_p = (pointer)&local_8d0.object_suffix.field_2;
  local_8d0.object_suffix.field_2._M_allocated_capacity._0_2_ = 0x54;
  local_8d0.object_suffix._M_string_length = 1;
  local_8d0.keyword_prefix._M_dataplus._M_p = (pointer)&local_8d0.keyword_prefix.field_2;
  local_8d0.keyword_prefix._M_string_length = 0;
  local_8d0.keyword_prefix.field_2._M_local_buf[0] = '\0';
  local_8d0.keyword_suffix._M_dataplus._M_p = (pointer)&local_8d0.keyword_suffix.field_2;
  local_8d0.keyword_suffix.field_2._M_local_buf[0] = '_';
  local_8d0.keyword_suffix._M_string_length = 1;
  local_8d0.keyword_suffix.field_2._M_local_buf[1] = '\0';
  local_8d0.filenames = kDasher;
  local_8d0.directories = kDasher;
  local_8d0.output_path._M_dataplus._M_p = (pointer)&local_8d0.output_path.field_2;
  local_8d0.output_path._M_string_length = 0;
  local_8d0.output_path.field_2._M_local_buf[0] = '\0';
  local_8d0.filename_suffix._M_dataplus._M_p = (pointer)&local_8d0.filename_suffix.field_2;
  local_8d0.filename_suffix.field_2._M_allocated_capacity = 0x746172656e65675f;
  local_8d0.filename_suffix.field_2._8_2_ = 0x6465;
  local_8d0.filename_suffix._M_string_length = 10;
  local_8d0.filename_suffix.field_2._M_local_buf[10] = '\0';
  local_8d0.filename_extension._M_dataplus._M_p = (pointer)&local_8d0.filename_extension.field_2;
  local_8d0.filename_extension.field_2._M_allocated_capacity._0_4_ = 0x73742e;
  local_8d0.filename_extension._M_string_length = 3;
  Namer::Config::Config((Config *)local_180,&local_8d0);
  std::__cxx11::string::_M_assign((string *)(local_180 + 0x68));
  std::__cxx11::string::_M_assign(local_f8);
  std::__cxx11::string::_M_assign(local_90);
  std::__cxx11::string::_M_assign(local_70);
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  local_780.field_2._M_allocated_capacity = 0x746e656d75677261;
  local_780.field_2._8_2_ = 0x73;
  local_780._M_string_length = 9;
  local_760 = &local_750;
  local_750 = 0x61657262;
  local_74c = 0x6b;
  local_758 = 5;
  local_740 = &local_730;
  local_730 = 0x65736163;
  local_738 = 4;
  local_72c = 0;
  local_720 = &local_710;
  local_710 = 0x63746163;
  local_70c = 0x68;
  local_718 = 5;
  local_700 = &local_6f0;
  local_6f0 = 0x73616c63;
  local_6ec = 0x73;
  local_6f8 = 5;
  local_6eb = 0;
  local_6e0 = &local_6d0;
  local_6d0 = 0x736e6f63;
  local_6cc = 0x74;
  local_6d8 = 5;
  local_6c0 = &local_6b0;
  local_6b0 = 0x65756e69746e6f63;
  local_6b8 = 8;
  local_6a8 = 0;
  local_6a0 = &local_690;
  local_690 = 0x7265676775626564;
  local_698 = 8;
  local_688 = 0;
  local_680 = &local_670;
  uStack_66c = 0x746c75;
  local_670 = 0x61666564;
  local_678 = 7;
  local_669 = 0;
  local_660 = &local_650;
  local_64c = 0x6574;
  local_650 = 0x656c6564;
  local_658 = 6;
  local_64a = 0;
  local_640 = &local_630;
  local_630 = 0x6f64;
  local_638 = 2;
  local_62e = 0;
  local_620 = &local_610;
  local_610 = 0x65736c65;
  local_618 = 4;
  local_60c = 0;
  local_600 = &local_5f0;
  local_5f0 = 0x6d756e65;
  local_5f8 = 4;
  local_5ec = 0;
  local_5e0 = &local_5d0;
  local_5cc = 0x7472;
  local_5d0 = 0x6f707865;
  local_5d8 = 6;
  local_5ca = 0;
  local_5c0 = &local_5b0;
  uStack_5ac = 0x73646e;
  local_5b0 = 0x65747865;
  local_5b8 = 7;
  local_5a9 = 0;
  local_5a0 = &local_590;
  local_58c = 0x65;
  local_590 = 0x736c6166;
  local_598 = 5;
  local_58b = 0;
  local_580 = &local_570;
  uStack_56c = 0x796c6c;
  local_570 = 0x616e6966;
  local_578 = 7;
  local_569 = 0;
  local_560 = &local_550;
  local_54e = 0x72;
  local_550 = 0x6f66;
  local_558 = 3;
  local_54d = 0;
  local_540 = &local_530;
  local_530 = 0x6e6f6974636e7566;
  local_538 = 8;
  local_528 = 0;
  local_520 = &local_510;
  local_510 = 0x6669;
  local_518 = 2;
  local_50e = 0;
  local_500 = &local_4f0;
  local_4ec = 0x7472;
  local_4f0 = 0x6f706d69;
  local_4f8 = 6;
  local_4ea = 0;
  local_4e0 = &local_4d0;
  local_4d0 = 0x6e69;
  local_4d8 = 2;
  local_4ce = 0;
  local_4c0 = &local_4b0;
  local_4a8 = 0x666f;
  local_4b0 = 0x65636e6174736e69;
  local_4b8 = 10;
  local_4a6 = 0;
  local_4a0 = &local_490;
  local_48e = 0x77;
  local_490 = 0x656e;
  local_498 = 3;
  local_48d = 0;
  local_480 = &local_470;
  local_470 = 0x6c6c756e;
  local_478 = 4;
  local_46c = 0;
  local_460 = &local_450;
  local_44c = 0x7463;
  local_450 = 0x656a624f;
  local_458 = 6;
  local_44a = 0;
  local_440 = &local_430;
  local_42c = 0x6e72;
  local_430 = 0x75746572;
  local_438 = 6;
  local_42a = 0;
  local_420 = &local_410;
  local_40c = 0x72;
  local_410 = 0x65707573;
  local_418 = 5;
  local_40b = 0;
  local_400 = &local_3f0;
  local_3ec = 0x6863;
  local_3f0 = 0x74697773;
  local_3f8 = 6;
  local_3ea = 0;
  local_3e0 = &local_3d0;
  local_3d0 = 0x73696874;
  local_3d8 = 4;
  local_3cc = 0;
  local_3c0 = &local_3b0;
  local_3ac = 0x77;
  local_3b0 = 0x6f726874;
  local_3b8 = 5;
  local_3ab = 0;
  local_3a0 = &local_390;
  local_390 = 0x65757274;
  local_398 = 4;
  local_38c = 0;
  local_380 = &local_370;
  local_36e = 0x79;
  local_370 = 0x7274;
  local_378 = 3;
  local_36d = 0;
  local_360 = &local_350;
  local_34c = 0x666f;
  local_350 = 0x65707974;
  local_358 = 6;
  local_34a = 0;
  local_340 = &local_330;
  local_32e = 0x72;
  local_330 = 0x6176;
  local_338 = 3;
  local_32d = 0;
  local_320 = &local_310;
  local_310 = 0x64696f76;
  local_318 = 4;
  local_30c = 0;
  local_300 = &local_2f0;
  local_2ec = 0x65;
  local_2f0 = 0x6c696877;
  local_2f8 = 5;
  local_2eb = 0;
  local_2e0 = &local_2d0;
  local_2d0 = 0x68746977;
  local_2d8 = 4;
  local_2cc = 0;
  local_2c0 = &local_2b0;
  local_2b0 = 0x7361;
  local_2b8 = 2;
  local_2ae = 0;
  local_2a0 = &local_290;
  local_290 = 0x6e656d656c706d69;
  local_288 = 0x7374;
  local_298 = 10;
  local_286 = 0;
  local_280 = &local_270;
  local_268 = 0x65;
  local_270 = 0x6361667265746e69;
  local_278 = 9;
  local_267 = 0;
  local_260 = &local_250;
  local_24e = 0x74;
  local_250 = 0x656c;
  local_258 = 3;
  local_24d = 0;
  local_240 = &local_230;
  uStack_22c = 0x656761;
  local_230 = 0x6b636170;
  local_238 = 7;
  local_229 = 0;
  local_220 = &local_210;
  uStack_20c = 0x657461;
  local_210 = 0x76697270;
  local_218 = 7;
  local_209 = 0;
  local_200 = &local_1f0;
  local_1e8 = 100;
  local_1f0 = 0x65746365746f7270;
  local_1f8 = 9;
  local_1e7 = 0;
  local_1e0 = &local_1d0;
  local_1cc = 0x6369;
  local_1d0 = 0x6c627570;
  local_1d8 = 6;
  local_1ca = 0;
  local_1c0 = &local_1b0;
  uStack_1ac = 0x6369;
  local_1b0 = 0x74617473;
  local_1b8 = 6;
  uStack_1aa = 0;
  plVar3 = &local_190;
  local_190._4_1_ = 100;
  local_190._0_4_ = 0x6c656979;
  local_1a0[1] = (long *)0x5;
  local_190._5_1_ = 0;
  __l._M_len = 0x30;
  __l._M_array = &local_780;
  local_1a0[0] = plVar3;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_900,__l,&local_961,&local_962);
  lVar2 = -0x600;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  IdlNamer::IdlNamer(&this->namer_,(Config *)local_180,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_900);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_900);
  Namer::Config::~Config((Config *)local_180);
  Namer::Config::~Config(&local_8d0);
  p_Var1 = &(this->ns_defs_)._M_t._M_impl.super__Rb_tree_header;
  (this->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

TsGenerator(const Parser &parser, const std::string &path,
              const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", "_", "ts"),
        namer_(WithFlagOptions(TypeScriptDefaultConfig(), parser.opts, path),
               TypescriptKeywords()) {}